

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_gme.cpp
# Opt level: O0

bool __thiscall GMESong::StartTrack(GMESong *this,int track,bool getcritsec)

{
  void *pvVar1;
  gme_err_t pcVar2;
  undefined8 in_stack_ffffffffffffffc8;
  gme_err_t err;
  bool getcritsec_local;
  int track_local;
  GMESong *this_local;
  
  if (getcritsec) {
    FCriticalSection::Enter(&this->CritSec);
  }
  pcVar2 = gme_start_track((Music_Emu *)this,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20));
  if (getcritsec) {
    FCriticalSection::Leave((FCriticalSection *)&(((Music_Emu *)this)->super_Gme_File).warning_);
  }
  if (pcVar2 == (gme_err_t)0x0) {
    *(int *)((long)&(((Music_Emu *)this)->super_Gme_File).playlist.entries.begin_ + 4) = track;
    GetTrackInfo(this);
    if (((ulong)(((Music_Emu *)this)->super_Gme_File).type_ & 0x100000000) == 0) {
      pvVar1 = (((Music_Emu *)this)->super_Gme_File).user_data_;
      CalcSongLength(this);
      gme_set_fade((Music_Emu *)this,(int)((ulong)pvVar1 >> 0x20));
    }
    this_local._7_1_ = true;
  }
  else {
    Printf("Could not start track %d: %s\n",(ulong)(uint)track,pcVar2);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool GMESong::StartTrack(int track, bool getcritsec)
{
	gme_err_t err;

	if (getcritsec)
	{
		CritSec.Enter();
	}
	err = gme_start_track(Emu, track);
	if (getcritsec)
	{
		CritSec.Leave();
	}
	if (err != NULL)
	{
		Printf("Could not start track %d: %s\n", track, err);
		return false;
	}
	CurrTrack = track;
	GetTrackInfo();
	if (!m_Looping)
	{
		gme_set_fade(Emu, CalcSongLength());
	}
	return true;
}